

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall capnp::compiler::NodeTranslator::StructLayout::Top::addData(Top *this,uint lgSize)

{
  undefined8 in_RAX;
  uint uVar1;
  ulong uVar2;
  char local_28 [4];
  uint local_24;
  
  uVar2 = (ulong)lgSize;
  _local_28 = in_RAX;
  HoleSet<unsigned_int>::tryAllocate((HoleSet<unsigned_int> *)local_28,(uint)&this->holes);
  if (local_28[0] == '\x01') {
  }
  else {
    local_24 = this->dataWordCount;
    this->dataWordCount = local_24 + 1;
    local_24 = local_24 << (6U - (char)lgSize & 0x1f);
    if (lgSize < 6) {
      uVar1 = local_24 + 1;
      do {
        (this->holes).holes[uVar2] = uVar1;
        uVar2 = uVar2 + 1;
        uVar1 = uVar1 + 1 >> 1;
      } while (uVar2 != 6);
    }
  }
  return local_24;
}

Assistant:

uint addData(uint lgSize) override {
      KJ_IF_MAYBE(hole, holes.tryAllocate(lgSize)) {
        return *hole;
      } else {
        uint offset = dataWordCount++ << (6 - lgSize);
        holes.addHolesAtEnd(lgSize, offset + 1);
        return offset;
      }